

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

double __thiscall cnn::expr::pow(expr *this,double __x,double __y)

{
  long in_RDX;
  initializer_list<cnn::VariableIndex> *in_RSI;
  double extraout_XMM0_Qa;
  ComputationGraph *pg;
  Expression *this_00;
  VariableIndex local_38;
  VariableIndex VStack_34;
  VariableIndex *local_30;
  undefined8 local_28;
  long local_18;
  ComputationGraph *this_01;
  
  pg = (ComputationGraph *)in_RSI->_M_array;
  this_00 = (Expression *)this;
  local_18 = in_RDX;
  this_01 = (ComputationGraph *)this;
  VariableIndex::VariableIndex(&local_38,(VariableIndex *)&in_RSI->_M_len);
  VariableIndex::VariableIndex(&VStack_34,(VariableIndex *)(local_18 + 8));
  local_30 = &local_38;
  local_28 = 2;
  ComputationGraph::add_function<cnn::Pow>(this_01,in_RSI);
  Expression::Expression(this_00,pg,(VariableIndex *)this);
  return extraout_XMM0_Qa;
}

Assistant:

Expression pow(const Expression& x, const Expression& y) { return Expression(x.pg, x.pg->add_function<Pow>({x.i, y.i})); }